

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O3

String * __thiscall
Diligent::ParserErrorMessage_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,char *Message,Char *pBuffer,
          Char *pBufferEnd,char *pCurrPos)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  String *pSVar4;
  stringstream Stream;
  Char *local_1e8;
  char *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = Message;
  if (Message < pBufferEnd) {
    do {
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != pBufferEnd);
  }
  local_1e8 = pBuffer;
  local_1e0 = Message;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: ",3);
  if (this == (Diligent *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)this,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  Parsing::GetContext<char_const*>
            (&local_1d8,(Parsing *)&local_1e0,&local_1e8,(char **)pBufferEnd,(char *)0x1,
             (size_t)pCurrPos);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  pSVar4 = (String *)std::ios_base::~ios_base(local_138);
  return pSVar4;
}

Assistant:

static String ParserErrorMessage(const char* Message, const Char* pBuffer, const Char* pBufferEnd, const char* pCurrPos)
{
    size_t      Line       = 0;
    const auto* pLineStart = pBuffer;
    for (const auto* c = pBuffer; c < pCurrPos; ++c)
    {
        if (*c == '\n')
        {
            ++Line;
            pLineStart = c;
        }
    }
    size_t LineOffset = pCurrPos - pLineStart;

    std::stringstream Stream;
    Stream << "[" << Line << "," << LineOffset << "]: " << Message << std::endl
           << GetContext(pBuffer, pBufferEnd, pCurrPos, 1);
    return Stream.str();
}